

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

void Saig_ManDetectConstrFuncTest
               (Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fOldAlgo,int fVerbose)

{
  Vec_Vec_t *local_30;
  Vec_Vec_t *vCands;
  int local_20;
  int fVerbose_local;
  int fOldAlgo_local;
  int nProps_local;
  int nConfs_local;
  int nFrames_local;
  Aig_Man_t *p_local;
  
  vCands._4_4_ = fVerbose;
  local_20 = fOldAlgo;
  fVerbose_local = nProps;
  fOldAlgo_local = nConfs;
  nProps_local = nFrames;
  _nConfs_local = p;
  if (fOldAlgo == 0) {
    local_30 = Ssw_ManFindDirectImplications(p,nFrames,nConfs,nProps,fVerbose);
  }
  else {
    local_30 = Saig_ManDetectConstrFunc(p,nFrames,nConfs,nProps,fVerbose);
  }
  Vec_VecFreeP(&local_30);
  return;
}

Assistant:

void Saig_ManDetectConstrFuncTest( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fOldAlgo, int fVerbose )
{
    Vec_Vec_t * vCands;
    if ( fOldAlgo )
        vCands = Saig_ManDetectConstrFunc( p, nFrames, nConfs, nProps, fVerbose );
    else
        vCands = Ssw_ManFindDirectImplications( p, nFrames, nConfs, nProps, fVerbose );
    Vec_VecFreeP( &vCands );
}